

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharBuffer.hpp
# Opt level: O1

void __thiscall antlr::CharBuffer::~CharBuffer(CharBuffer *this)

{
  pointer piVar1;
  
  (this->super_InputBuffer)._vptr_InputBuffer = (_func_int **)&PTR__InputBuffer_00305fe8;
  piVar1 = (this->super_InputBuffer).queue.storage.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->super_InputBuffer).queue.storage.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

class ANTLR_API CharBuffer : public InputBuffer {
public:
	/// Create a character buffer
	CharBuffer( ANTLR_USE_NAMESPACE(std)istream& input );
	/// Get the next character from the stream
	int getChar();

protected:

private:
	// character source
	ANTLR_USE_NAMESPACE(std)istream& input;

	// NOTE: Unimplemented
	CharBuffer(const CharBuffer& other);
	CharBuffer& operator=(const CharBuffer& other);
}